

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

void __thiscall SEIUnit::processBlurayOffsetMetadata(SEIUnit *this)

{
  BitStreamReader *this_00;
  int iVar1;
  uint uVar2;
  
  this_00 = &(this->super_NALUnit).bitReader;
  BitStreamReader::skipBits(this_00,8);
  iVar1 = *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
  this->metadataPtsOffset =
       ((int)(((*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer - iVar1) * 8 -
              (this->super_NALUnit).bitReader.m_bitLeft) + 0x20) / 8 + iVar1) -
       *(int *)&(this->super_NALUnit).m_nalBuffer;
  BitStreamReader::skipBits(this_00,0x18);
  BitStreamReader::skipBits(this_00,0x12);
  uVar2 = BitStreamReader::getBits(this_00,6);
  this->number_of_offset_sequences = uVar2 & 0xff;
  return;
}

Assistant:

void SEIUnit::processBlurayOffsetMetadata()
{
    bitReader.skipBits(8);
    const uint8_t* ptr = bitReader.getBuffer() + bitReader.getBitsCount() / 8;
    metadataPtsOffset = static_cast<int>(ptr - m_nalBuffer);
    bitReader.skipBits(24);  // PTS[32..30], marker_bit, PTS[29..15]
    bitReader.skipBits(18);  // marker_bit, PTS[14..0], marker_bit, reserved_for_future_use bit
    number_of_offset_sequences = bitReader.getBits<uint8_t>(6);
}